

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchpattern(regex_t *pattern,char *text,int *matchlength)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  regex_t p;
  regex_t p_00;
  regex_t p_01;
  regex_t p_02;
  int pre;
  int *matchlength_local;
  char *text_local;
  regex_t *pattern_local;
  
  iVar1 = *matchlength;
  matchlength_local = (int *)text;
  text_local = (char *)pattern;
  do {
    if ((*text_local == '\0') || (text_local[0x10] == '\x04')) {
      p._1_7_ = 0;
      p.type = *text_local;
      p.u.ccl = ((anon_union_8_2_c9599718_for_u *)(text_local + 8))->ccl;
      iVar1 = matchquestion(p,(regex_t *)(text_local + 0x20),(char *)matchlength_local,matchlength);
      return iVar1;
    }
    if (text_local[0x10] == '\x05') {
      p_00._1_7_ = 0;
      p_00.type = *text_local;
      p_00.u.ccl = ((anon_union_8_2_c9599718_for_u *)(text_local + 8))->ccl;
      iVar1 = matchstar(p_00,(regex_t *)(text_local + 0x20),(char *)matchlength_local,matchlength);
      return iVar1;
    }
    if (text_local[0x10] == '\x06') {
      p_01._1_7_ = 0;
      p_01.type = *text_local;
      p_01.u.ccl = ((anon_union_8_2_c9599718_for_u *)(text_local + 8))->ccl;
      iVar1 = matchplus(p_01,(regex_t *)(text_local + 0x20),(char *)matchlength_local,matchlength);
      return iVar1;
    }
    if ((*text_local == '\x03') && (text_local[0x10] == '\0')) {
      return (uint)((char)*matchlength_local == '\0');
    }
    *matchlength = *matchlength + 1;
    bVar3 = false;
    if ((char)*matchlength_local != '\0') {
      p_02._1_7_ = 0;
      p_02.type = *text_local;
      p_02.u.ccl = ((anon_union_8_2_c9599718_for_u *)(text_local + 8))->ccl;
      iVar2 = matchone(p_02,(char)*matchlength_local);
      bVar3 = iVar2 != 0;
      matchlength_local = (int *)((long)matchlength_local + 1);
      text_local = text_local + 0x10;
    }
  } while (bVar3);
  *matchlength = iVar1;
  return 0;
}

Assistant:

static int matchpattern(regex_t* pattern, const char* text, int* matchlength)
{
  int pre = *matchlength;
  do
  {
    if ((pattern[0].type == UNUSED) || (pattern[1].type == QUESTIONMARK))
    {
      return matchquestion(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == STAR)
    {
      return matchstar(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == PLUS)
    {
      return matchplus(pattern[0], &pattern[2], text, matchlength);
    }
    else if ((pattern[0].type == END) && pattern[1].type == UNUSED)
    {
      return (text[0] == '\0');
    }
/*  Branching is not working properly
    else if (pattern[1].type == BRANCH)
    {
      return (matchpattern(pattern, text) || matchpattern(&pattern[2], text));
    }
*/
  (*matchlength)++;
  }
  while ((text[0] != '\0') && matchone(*pattern++, *text++));

  *matchlength = pre;
  return 0;
}